

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmCommandContext *lfc,cmExecutionStatus *status)

{
  pointer *pppcVar1;
  pointer *pppcVar2;
  iterator __position;
  cmMakefile *pcVar3;
  iterator __position_00;
  cmCommandContext *local_18;
  
  this->Makefile = mf;
  __position._M_current =
       (mf->ContextStack).
       super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (mf->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18 = lfc;
    std::vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>>::
    _M_realloc_insert<cmCommandContext_const*>
              ((vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>> *)
               &mf->ContextStack,__position,&local_18);
  }
  else {
    *__position._M_current = lfc;
    pppcVar1 = &(mf->ContextStack).
                super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = this->Makefile;
  __position_00._M_current =
       (pcVar3->ExecutionStatusStack).
       super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (pcVar3->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_18 = (cmCommandContext *)status;
    std::vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>>::
    _M_realloc_insert<cmExecutionStatus*>
              ((vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>> *)
               &pcVar3->ExecutionStatusStack,__position_00,(cmExecutionStatus **)&local_18);
  }
  else {
    *__position_00._M_current = status;
    pppcVar2 = &(pcVar3->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar2 = *pppcVar2 + 1;
  }
  return;
}

Assistant:

cmMakefileCall::cmMakefileCall(cmMakefile* mf, const cmCommandContext& lfc,
                               cmExecutionStatus& status): Makefile(mf)
{
  this->Makefile->ContextStack.push_back(&lfc);
  this->Makefile->ExecutionStatusStack.push_back(&status);
}